

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcombobox.cpp
# Opt level: O0

void __thiscall QComboBoxPrivate::modelReset(QComboBoxPrivate *this)

{
  long lVar1;
  QComboBoxPrivate *in_RDI;
  long in_FS_OFFSET;
  QComboBox *q;
  QWidget *in_stack_ffffffffffffffb8;
  QComboBoxPrivate *in_stack_ffffffffffffffc0;
  QComboBoxPrivate *in_stack_ffffffffffffffe8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  if (in_RDI->lineEdit != (QLineEdit *)0x0) {
    in_stack_ffffffffffffffc0 = (QComboBoxPrivate *)in_RDI->lineEdit;
    QString::QString((QString *)0x530c8c);
    QLineEdit::setText((QLineEdit *)in_stack_ffffffffffffffc0,(QString *)in_stack_ffffffffffffffb8);
    QString::~QString((QString *)0x530ca5);
    updateLineEditGeometry(in_stack_ffffffffffffffe8);
  }
  trySetValidIndex(in_stack_ffffffffffffffe8);
  modelChanged(in_stack_ffffffffffffffc0);
  QWidget::update(in_stack_ffffffffffffffb8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QComboBoxPrivate::modelReset()
{
    Q_Q(QComboBox);
    if (lineEdit) {
        lineEdit->setText(QString());
        updateLineEditGeometry();
    }
    trySetValidIndex();
    modelChanged();
    q->update();
}